

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# round_trip_wl.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  uint blocks_00;
  uint uVar1;
  uint uVar2;
  uint bins;
  char *pcVar3;
  ostream *poVar4;
  allocator<char> local_2959;
  string local_2958;
  string local_2938;
  allocator<char> local_2911;
  string local_2910;
  string local_28f0;
  double local_28d0;
  double delta;
  int n;
  uint round_trip_time;
  uint previous_count;
  uint round_trip;
  double std_round_trip;
  double mean_round_trip;
  undefined1 local_28a0 [4];
  uint step;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  result;
  WangLandauSampler sampler;
  Random rng;
  undefined1 local_e8 [8];
  Histogram<unsigned_int> histogram;
  FixedDegreeNetwork network;
  uint total_wl_steps;
  uint round_trips;
  char *env_round_trips;
  uint blocks;
  char *env_blocks;
  
  pcVar3 = getenv("BLOCKS");
  if (pcVar3 == (char *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"BLOCKS not defined");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  blocks_00 = atoi(pcVar3);
  pcVar3 = getenv("ROUND_TRIPS");
  if (pcVar3 == (char *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ROUND_TRIPS not defined");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  uVar1 = atoi(pcVar3);
  this = &histogram._histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  FixedDegreeNetwork::FixedDegreeNetwork((FixedDegreeNetwork *)this,3,blocks_00);
  uVar2 = Network::get_triangles((Network *)this);
  bins = Network::get_triangles
                   ((Network *)
                    &histogram._histogram.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  Histogram<unsigned_int>::Histogram((Histogram<unsigned_int> *)local_e8,0,uVar2,bins);
  Random::Random((Random *)&sampler.f,2);
  WangLandauSampler::WangLandauSampler
            ((WangLandauSampler *)
             &result.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Random *)&sampler.f,
             (Histogram<unsigned_int> *)local_e8,
             (Network *)
             &histogram._histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    uVar2 = Network::get_triangles
                      ((Network *)
                       &histogram._histogram.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (uVar2 == 0) break;
    WangLandauSampler::markov_step
              ((WangLandauSampler *)
               &result.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_28a0);
  for (mean_round_trip._4_4_ = 0; mean_round_trip._4_4_ < 0xf;
      mean_round_trip._4_4_ = mean_round_trip._4_4_ + 1) {
    Histogram<unsigned_int>::reset((Histogram<unsigned_int> *)local_e8);
    std_round_trip = 0.0;
    _previous_count = 0.0;
    for (round_trip_time = 0; round_trip_time < uVar1; round_trip_time = round_trip_time + 1) {
      n = Histogram<unsigned_int>::count((Histogram<unsigned_int> *)local_e8);
      WangLandauSampler::perform_round_trip
                ((WangLandauSampler *)
                 &result.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar2 = Histogram<unsigned_int>::count((Histogram<unsigned_int> *)local_e8);
      delta._4_4_ = uVar2 - n;
      delta._0_4_ = round_trip_time + 1;
      local_28d0 = (double)delta._4_4_ - std_round_trip;
      std_round_trip = std_round_trip + local_28d0 / (double)delta._0_4_;
      _previous_count = local_28d0 * ((double)delta._4_4_ - std_round_trip) + _previous_count;
    }
    WangLandauSampler::wang_landau_step
              ((WangLandauSampler *)
               &result.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2910,"wl_B%d_S%d.dat",&local_2911);
    format(&local_28f0,&local_2910,(ulong)blocks_00,(ulong)uVar1);
    WangLandauSampler::export_entropy
              ((WangLandauSampler *)
               &result.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_28f0);
    std::__cxx11::string::~string((string *)&local_28f0);
    std::__cxx11::string::~string((string *)&local_2910);
    std::allocator<char>::~allocator(&local_2911);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2958,"results/histogram_wl_B%d_S%d.dat",&local_2959);
    format(&local_2938,&local_2958,(ulong)blocks_00,(ulong)uVar1);
    Histogram<unsigned_int>::export_histogram((Histogram<unsigned_int> *)local_e8,&local_2938);
    std::__cxx11::string::~string((string *)&local_2938);
    std::__cxx11::string::~string((string *)&local_2958);
    std::allocator<char>::~allocator(&local_2959);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_28a0);
  WangLandauSampler::~WangLandauSampler
            ((WangLandauSampler *)
             &result.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Random::~Random((Random *)&sampler.f);
  Histogram<unsigned_int>::~Histogram((Histogram<unsigned_int> *)local_e8);
  FixedDegreeNetwork::~FixedDegreeNetwork
            ((FixedDegreeNetwork *)
             &histogram._histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main() {
    char *env_blocks = getenv("BLOCKS");
    if (env_blocks == NULL) {std::cout << "BLOCKS not defined" << std::endl; exit(1);}
    unsigned int blocks = (unsigned int)atoi(env_blocks);

    char *env_round_trips = getenv("ROUND_TRIPS");
    if (env_round_trips == NULL) {std::cout << "ROUND_TRIPS not defined" << std::endl; exit(1);}
    unsigned int round_trips = (unsigned int)atoi(env_round_trips);

    unsigned int total_wl_steps = 15;

    FixedDegreeNetwork network(3, blocks);

    Histogram<unsigned int> histogram(0, network.get_triangles(), network.get_triangles());
    Random rng(2);

    WangLandauSampler sampler(rng, histogram, network);

    // warm up
    while (network.get_triangles() != 0)
        sampler.markov_step();

    std::vector<std::vector<double> > result;

    for (unsigned int step = 0; step < total_wl_steps; step++) {
        histogram.reset();

        double mean_round_trip = 0;
        double std_round_trip = 0;
        for (unsigned int round_trip = 0; round_trip < round_trips; round_trip++) {
            unsigned int previous_count = histogram.count();
            sampler.perform_round_trip();
            unsigned int round_trip_time = histogram.count() - previous_count;

            // update formula: https://en.wikipedia.org/wiki/Algorithms_for_calculating_variance#Online_algorithm
            int n = round_trip + 1;
            double delta = round_trip_time - mean_round_trip;
            mean_round_trip += delta/n;
            std_round_trip += delta*(round_trip_time - mean_round_trip);
        }
        sampler.wang_landau_step();

        sampler.export_entropy(format("wl_B%d_S%d.dat", blocks, round_trips));
        histogram.export_histogram(format("results/histogram_wl_B%d_S%d.dat", blocks, round_trips));
    }
    return 0;
}